

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int binsertch(bstring b,int pos,int len,uchar fill)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  
  iVar2 = -1;
  if ((((b != (bstring)0x0 && -1 < pos) && (uVar1 = b->slen, -1 < (int)uVar1)) &&
      ((int)uVar1 <= b->mlen)) && (-1 < len && b->mlen != 0)) {
    uVar5 = len + pos;
    uVar3 = (ulong)uVar5;
    if (uVar1 < (uint)pos) {
      iVar2 = balloc(b,uVar5 + 1);
      if (iVar2 != 0) {
        return -1;
      }
      pos = b->slen;
    }
    else {
      uVar5 = uVar1 + len;
      iVar2 = balloc(b,uVar5 + 1);
      if (iVar2 != 0) {
        return -1;
      }
      for (lVar4 = (long)(int)uVar5; (long)uVar3 < lVar4; lVar4 = lVar4 + -1) {
        b->data[lVar4 + -1] = b->data[(lVar4 + -1) - (ulong)(uint)len];
      }
    }
    b->slen = uVar5;
    for (lVar4 = (long)pos; lVar4 < (long)uVar3; lVar4 = lVar4 + 1) {
      b->data[lVar4] = fill;
    }
    b->data[b->slen] = '\0';
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int binsertch (bstring b, int pos, int len, unsigned char fill) {
int d, l, i;

	if (pos < 0 || b == NULL || b->slen < 0 || b->mlen < b->slen ||
	    b->mlen <= 0 || len < 0) return BSTR_ERR;

	/* Compute the two possible end pointers */
	d = b->slen + len;
	l = pos + len;
	if ((d|l) < 0) return BSTR_ERR;

	if (l > d) {
		/* Inserting past the end of the string */
		if (balloc (b, l + 1) != BSTR_OK) return BSTR_ERR;
		pos = b->slen;
		b->slen = l;
	} else {
		/* Inserting in the middle of the string */
		if (balloc (b, d + 1) != BSTR_OK) return BSTR_ERR;
		for (i = d - 1; i >= l; i--) {
			b->data[i] = b->data[i - len];
		}
		b->slen = d;
	}

	for (i=pos; i < l; i++) b->data[i] = fill;
	b->data[b->slen] = (unsigned char) '\0';
	return BSTR_OK;
}